

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void clipme(Terminal *term,pos top,pos bottom,_Bool rect,_Bool desel,int *clipboards,
           wchar_t n_clipboards)

{
  long lVar1;
  truecolour tc;
  bool bVar2;
  bool bVar3;
  wchar_t mblen;
  unsigned_long uVar4;
  ulong uVar5;
  _Bool _Var6;
  wchar_t wVar7;
  termline *line;
  termchar *ptVar8;
  wchar_t wVar9;
  undefined7 in_register_00000009;
  uint uVar10;
  int iVar11;
  long lVar12;
  unicode_data *puVar13;
  wchar_t *pwVar14;
  long lVar15;
  ulong uVar16;
  wchar_t wVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  wchar_t y;
  wchar_t local_11c;
  char buf_1 [4];
  wchar_t local_110;
  ulong local_108;
  clip_workbuf buf;
  wchar_t wbuf [4];
  wchar_t cbuf [16];
  
  uVar19 = (ulong)top >> 0x20;
  buf.bufsize = 0x1400;
  buf.bufpos = 0;
  buf.textbuf = (wchar_t *)safemalloc(0x1400,4,0);
  buf.textptr = buf.textbuf;
  buf.attrbuf = (wchar_t *)safemalloc(0x1400,4,0);
  buf.attrptr = buf.attrbuf;
  buf.tcbuf = (truecolour *)safemalloc(0x1400,8,0);
  buf.tcptr = buf.tcbuf;
  uVar16 = CONCAT71(in_register_00000009,rect);
  if ((int)CONCAT71(in_register_00000009,rect) != 0) {
    uVar16 = uVar19;
  }
  do {
    wVar17 = bottom.x;
    local_110 = bottom.y;
    y = top.y;
    bVar20 = y < local_110;
    if (y == local_110) {
      bVar20 = (wchar_t)uVar19 < wVar17;
    }
    if (!bVar20) {
      uVar19 = 0;
      uVar16 = (ulong)(uint)n_clipboards;
      if (n_clipboards < L'\x01') {
        uVar16 = uVar19;
      }
      bVar20 = false;
      for (; uVar16 != uVar19; uVar19 = uVar19 + 1) {
        wVar17 = clipboards[uVar19];
        bVar2 = bVar20;
        if ((wVar17 != L'\0') && (bVar2 = true, wVar17 != L'\x01')) {
          (*term->win->vt->clip_write)
                    (term->win,wVar17,buf.textbuf,buf.attrbuf,buf.tcbuf,(wchar_t)buf.bufpos,desel);
          bVar2 = bVar20;
        }
        bVar20 = bVar2;
      }
      if (bVar20) {
        safefree(term->last_selected_text);
        safefree(term->last_selected_attr);
        safefree(term->last_selected_tc);
        term->last_selected_text = buf.textbuf;
        term->last_selected_attr = buf.attrbuf;
        term->last_selected_tc = buf.tcbuf;
        term->last_selected_len = buf.bufpos;
      }
      else {
        safefree(buf.textbuf);
        safefree(buf.attrbuf);
        safefree(buf.tcbuf);
      }
      return;
    }
    line = lineptr(term,y,L'ᤲ',L'\0');
    wVar7 = term->cols;
    local_11c = y;
    if ((line->lattr & 0x10) == 0) {
      lVar12 = (long)wVar7 * 0x20 + -8;
      lVar15 = (long)wVar7;
      while (lVar15 != 0) {
        lVar1 = *(long *)((long)line->chars + lVar12 + -0x18);
        if (((lVar1 != 0x20 && ((uint)lVar1 & 0xfffffcff) != 0xd820) ||
            (*(int *)((long)&line->chars->chr + lVar12) != 0)) || (lVar15 <= (wchar_t)uVar19))
        goto LAB_0010a3de;
        lVar12 = lVar12 + -0x20;
        lVar15 = lVar15 + -1;
      }
      lVar15 = 0;
LAB_0010a3de:
      wVar7 = (wchar_t)lVar15;
      bVar20 = y < local_110;
      if (y == local_110) {
        bVar20 = wVar7 < wVar17;
      }
    }
    else {
      wVar9 = wVar7 + L'\xfffffffd';
      if (wVar7 < L'\x03') {
        wVar9 = L'\0';
      }
      if (line->trusted == false) {
        wVar9 = wVar7;
      }
      if ((line->lattr & 0x20) != 0) {
        if (wVar9 == L'\0') {
          local_11c = y + L'\xffffffff';
          bVar20 = false;
          goto LAB_0010a3fc;
        }
        wVar9 = wVar9 + L'\xffffffff';
      }
      wVar7 = wVar9;
      bVar20 = false;
    }
LAB_0010a3fc:
    wVar9 = wVar17;
    if (wVar7 < wVar17) {
      wVar9 = wVar7;
    }
    if (!rect) {
      wVar9 = wVar7;
    }
    while( true ) {
      local_108._0_4_ = (wchar_t)uVar19;
      bVar2 = y < local_110;
      if (y == local_110) {
        bVar2 = (wchar_t)local_108 < wVar17;
      }
      bVar3 = y < local_11c;
      if (y == local_11c) {
        bVar3 = (wchar_t)local_108 < wVar9;
      }
      if ((!bVar2) || (!bVar3)) break;
      ptVar8 = line->chars;
      uVar5 = uVar19;
      if (ptVar8[(wchar_t)local_108].chr != 0xdfff) {
        do {
          local_108 = uVar5;
          iVar18 = (int)uVar19;
          uVar19 = ptVar8[iVar18].chr;
          uVar10 = (uint)uVar19 & 0xffffff00;
          if (uVar10 == 0xda00) {
            pwVar14 = term->ucsdata->unitab_scoacs;
LAB_0010a4e9:
            uVar19 = (ulong)(uint)pwVar14[uVar19 & 0xff];
          }
          else {
            if (uVar10 == 0xd900) {
              puVar13 = term->ucsdata;
              if (term->rawcnp != false) goto LAB_0010a4c7;
              pwVar14 = puVar13->unitab_xterm;
              goto LAB_0010a4e9;
            }
            if (uVar10 == 0xd800) {
              puVar13 = term->ucsdata;
LAB_0010a4c7:
              pwVar14 = puVar13->unitab_line;
              goto LAB_0010a4e9;
            }
          }
          wVar7 = (wchar_t)uVar19;
          if ((wVar7 & 0xffffff00U) == 0xdd00) {
            lVar15 = 0x80c;
LAB_0010a513:
            wVar7 = *(wchar_t *)
                     ((long)term->ucsdata->unitab_scoacs + (uVar19 & 0xff) * 4 + lVar15 + -0xc);
          }
          else if ((wVar7 & 0xffffff00U) == 0xdc00) {
            lVar15 = 0x100c;
            goto LAB_0010a513;
          }
          uVar4 = ptVar8[iVar18].attr;
          tc = ptVar8[iVar18].truecolour;
          cbuf[0] = wVar7;
          cbuf[1] = L'\0';
          if (((wVar7 & 0xfffffe00U) == 0xdc00) &&
             ((wVar7 & 0xffU) != 0x7f && 0x1f < (uint)(wVar7 & 0xffU))) {
            _Var6 = is_dbcs_leadbyte(term->ucsdata->font_codepage,(char)wVar7);
            if (_Var6) {
              iVar11 = (int)local_108;
              local_108 = (ulong)(iVar11 + 1);
              buf_1[1] = (char)line->chars[(long)iVar11 + 1].chr;
              mblen = L'\x02';
            }
            else {
              mblen = L'\x01';
            }
            buf_1[0] = (char)wVar7;
            wVar7 = mb_to_wc(term->ucsdata->font_codepage,L'\0',buf_1,mblen,wbuf,L'\x04');
            if (L'\0' < wVar7) {
              memcpy(cbuf,wbuf,(ulong)(uint)wVar7 * 4);
              cbuf[(uint)wVar7] = L'\0';
            }
          }
          for (pwVar14 = cbuf; *pwVar14 != L'\0'; pwVar14 = pwVar14 + 1) {
            clip_addchar(&buf,*pwVar14,(wchar_t)uVar4,tc);
          }
          ptVar8 = line->chars;
          uVar19 = (ulong)(uint)(iVar18 + ptVar8[iVar18].cc_next);
          uVar5 = local_108;
        } while (ptVar8[iVar18].cc_next != L'\0');
      }
      uVar19 = (ulong)(uint)((wchar_t)local_108 + L'\x01');
    }
    if (rect) {
      bVar20 = y < local_110;
    }
    if (bVar20) {
      clip_addchar(&buf,L'\n',L'\0',(term->basic_erase_char).truecolour);
    }
    top.y = y + L'\x01';
    top.x = L'\0';
    unlineptr(line);
    uVar19 = uVar16 & 0xffffffff;
  } while( true );
}

Assistant:

static void clipme(Terminal *term, pos top, pos bottom, bool rect, bool desel,
                   const int *clipboards, int n_clipboards)
{
    clip_workbuf buf;
    int old_top_x;
    int attr;
    truecolour tc;

    buf.bufsize = 5120;
    buf.bufpos = 0;
    buf.textptr = buf.textbuf = snewn(buf.bufsize, wchar_t);
    buf.attrptr = buf.attrbuf = snewn(buf.bufsize, int);
    buf.tcptr = buf.tcbuf = snewn(buf.bufsize, truecolour);

    old_top_x = top.x;                 /* needed for rect==1 */

    while (poslt(top, bottom)) {
        bool nl = false;
        termline *ldata = lineptr(top.y);
        pos nlpos;

        /*
         * nlpos will point at the maximum position on this line we
         * should copy up to. So we start it at the end of the
         * line...
         */
        nlpos.y = top.y;
        nlpos.x = term->cols;

        /*
         * ... move it backwards if there's unused space at the end
         * of the line (and also set `nl' if this is the case,
         * because in normal selection mode this means we need a
         * newline at the end)...
         */
        if (!(ldata->lattr & LATTR_WRAPPED)) {
            while (nlpos.x &&
                   IS_SPACE_CHR(ldata->chars[nlpos.x - 1].chr) &&
                   !ldata->chars[nlpos.x - 1].cc_next &&
                   poslt(top, nlpos))
                decpos(nlpos);
            if (poslt(nlpos, bottom))
                nl = true;
        } else {
            if (ldata->trusted) {
                /* A wrapped line with a trust sigil on it terminates
                 * a few characters earlier. */
                nlpos.x = (nlpos.x < TRUST_SIGIL_WIDTH ? 0 :
                           nlpos.x - TRUST_SIGIL_WIDTH);
            }
            if (ldata->lattr & LATTR_WRAPPED2) {
                /* Ignore the last char on the line in a WRAPPED2 line. */
                decpos(nlpos);
            }
        }

        /*
         * ... and then clip it to the terminal x coordinate if
         * we're doing rectangular selection. (In this case we
         * still did the above, so that copying e.g. the right-hand
         * column from a table doesn't fill with spaces on the
         * right.)
         */
        if (rect) {
            if (nlpos.x > bottom.x)
                nlpos.x = bottom.x;
            nl = (top.y < bottom.y);
        }

        while (poslt(top, bottom) && poslt(top, nlpos)) {
#if 0
            char cbuf[16], *p;
            sprintf(cbuf, "<U+%04x>", (ldata[top.x] & 0xFFFF));
#else
            wchar_t cbuf[16], *p;
            int c;
            int x = top.x;

            if (ldata->chars[x].chr == UCSWIDE) {
                top.x++;
                continue;
            }

            while (1) {
                int uc = ldata->chars[x].chr;
                attr = ldata->chars[x].attr;
                tc = ldata->chars[x].truecolour;

                switch (uc & CSET_MASK) {
                  case CSET_LINEDRW:
                    if (!term->rawcnp) {
                        uc = term->ucsdata->unitab_xterm[uc & 0xFF];
                        break;
                    }
                  case CSET_ASCII:
                    uc = term->ucsdata->unitab_line[uc & 0xFF];
                    break;
                  case CSET_SCOACS:
                    uc = term->ucsdata->unitab_scoacs[uc&0xFF];
                    break;
                }
                switch (uc & CSET_MASK) {
                  case CSET_ACP:
                    uc = term->ucsdata->unitab_font[uc & 0xFF];
                    break;
                  case CSET_OEMCP:
                    uc = term->ucsdata->unitab_oemcp[uc & 0xFF];
                    break;
                }

                c = (uc & ~CSET_MASK);
#ifdef PLATFORM_IS_UTF16
                if (uc > 0x10000 && uc < 0x110000) {
                    cbuf[0] = 0xD800 | ((uc - 0x10000) >> 10);
                    cbuf[1] = 0xDC00 | ((uc - 0x10000) & 0x3FF);
                    cbuf[2] = 0;
                } else
#endif
                {
                    cbuf[0] = uc;
                    cbuf[1] = 0;
                }

                if (DIRECT_FONT(uc)) {
                    if (c >= ' ' && c != 0x7F) {
                        char buf[4];
                        WCHAR wbuf[4];
                        int rv;
                        if (is_dbcs_leadbyte(term->ucsdata->font_codepage, (BYTE) c)) {
                            buf[0] = c;
                            buf[1] = (char) (0xFF & ldata->chars[top.x + 1].chr);
                            rv = mb_to_wc(term->ucsdata->font_codepage, 0, buf, 2, wbuf, 4);
                            top.x++;
                        } else {
                            buf[0] = c;
                            rv = mb_to_wc(term->ucsdata->font_codepage, 0, buf, 1, wbuf, 4);
                        }

                        if (rv > 0) {
                            memcpy(cbuf, wbuf, rv * sizeof(wchar_t));
                            cbuf[rv] = 0;
                        }
                    }
                }
#endif

                for (p = cbuf; *p; p++)
                    clip_addchar(&buf, *p, attr, tc);

                if (ldata->chars[x].cc_next)
                    x += ldata->chars[x].cc_next;
                else
                    break;
            }
            top.x++;
        }
        if (nl) {
            int i;
            for (i = 0; i < sel_nl_sz; i++)
                clip_addchar(&buf, sel_nl[i], 0, term->basic_erase_char.truecolour);
        }
        top.y++;
        top.x = rect ? old_top_x : 0;

        unlineptr(ldata);
    }
#if SELECTION_NUL_TERMINATED
    clip_addchar(&buf, 0, 0, term->basic_erase_char.truecolour);
#endif
    /* Finally, transfer all that to the clipboard(s). */
    {
        int i;
        bool clip_local = false;
        for (i = 0; i < n_clipboards; i++) {
            if (clipboards[i] == CLIP_LOCAL) {
                clip_local = true;
            } else if (clipboards[i] != CLIP_NULL) {
                win_clip_write(
                    term->win, clipboards[i], buf.textbuf, buf.attrbuf,
                    buf.tcbuf, buf.bufpos, desel);
            }
        }
        if (clip_local) {
            sfree(term->last_selected_text);
            sfree(term->last_selected_attr);
            sfree(term->last_selected_tc);
            term->last_selected_text = buf.textbuf;
            term->last_selected_attr = buf.attrbuf;
            term->last_selected_tc = buf.tcbuf;
            term->last_selected_len = buf.bufpos;
        } else {
            sfree(buf.textbuf);
            sfree(buf.attrbuf);
            sfree(buf.tcbuf);
        }
    }
}